

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Bdd __thiscall
sylvan::Bdd::VariablesCube(Bdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *variables)

{
  bool bVar1;
  MTBDD high;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  high = 0x8000000000000000;
  uVar2 = (int)((ulong)(*(long *)(variables + 8) - *(long *)variables) >> 2) - 1;
  if (-1 < (int)uVar2) {
    lVar3 = (ulong)uVar2 + 1;
    do {
      if (high == 0) {
        high = 0;
      }
      else {
        high = _mtbdd_makenode(*(uint32_t *)(*(long *)variables + -4 + lVar3 * 4),0,high);
      }
      lVar4 = lVar3 + -1;
      bVar1 = 0 < lVar3;
      lVar3 = lVar4;
    } while (lVar4 != 0 && bVar1);
  }
  this->bdd = high;
  mtbdd_protect(&this->bdd);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::VariablesCube(std::vector<uint32_t> variables)
{
    BDD result = sylvan_true;
    for (int i=variables.size()-1; i>=0; i--) {
        result = sylvan_makenode(variables[i], sylvan_false, result);
    }
    return result;
}